

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

void __thiscall senjo::UCIAdapter::PrintCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  uint uVar2;
  Output *this_00;
  Output local_38 [3];
  Output local_20;
  char *local_18;
  char *params_local;
  UCIAdapter *this_local;
  
  local_18 = params;
  params_local = (char *)this;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&local_18);
  if (bVar1) {
    Output::Output(&local_20,InfoPrefix);
    this_00 = Output::operator<<(&local_20,(char (*) [8])"usage: ");
    Output::operator<<(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               token::Print_abi_cxx11_);
    Output::~Output(&local_20);
    Output::Output(local_38,InfoPrefix);
    Output::operator<<(local_38,(char (*) [52])"Output text representation of the current position."
                      );
    Output::~Output(local_38);
  }
  else {
    uVar2 = (*this->engine->_vptr_ChessEngine[8])();
    if ((uVar2 & 1) == 0) {
      (*this->engine->_vptr_ChessEngine[7])();
    }
    (*this->engine->_vptr_ChessEngine[0xc])();
  }
  return;
}

Assistant:

void UCIAdapter::PrintCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Print;
    Output() << "Output text representation of the current position.";
    return;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
  }
  engine->PrintBoard();
}